

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_userdata.cpp
# Opt level: O0

int __thiscall
ON_UserStringList::SetUserStrings(ON_UserStringList *this,int count,ON_UserString *us,bool bReplace)

{
  bool bVar1;
  int iVar2;
  ON__UINT32 OVar3;
  ON_UserString *pOVar4;
  size_t nel;
  ON_2dex *base;
  int local_74;
  ON_2dex *pOStack_70;
  int deleted_count;
  ON_2dex *h;
  ON_2dex *hash1;
  ON_2dex *hash;
  size_t count0_plus_count;
  ulong uStack_48;
  int count0;
  size_t k1;
  size_t k0;
  int local_30;
  int i;
  int added_count;
  bool bReplace_local;
  ON_UserString *us_local;
  int count_local;
  ON_UserStringList *this_local;
  
  local_30 = 0;
  if ((count < 1) || (us == (ON_UserString *)0x0)) {
    this_local._4_4_ = 0;
  }
  else if (count == 1) {
    bVar1 = ON_wString::IsEmpty(&us->m_key);
    if (bVar1) {
      this_local._4_4_ = 0;
    }
    else {
      for (k0._4_4_ = 0; iVar2 = ON_ClassArray<ON_UserString>::Count(&this->m_e), k0._4_4_ < iVar2;
          k0._4_4_ = k0._4_4_ + 1) {
        pOVar4 = ON_ClassArray<ON_UserString>::operator[](&this->m_e,k0._4_4_);
        iVar2 = ON_wString::CompareOrdinal(&pOVar4->m_key,&us->m_key,true);
        if (iVar2 == 0) {
          if (bReplace) {
            bVar1 = ON_wString::IsEmpty(&us->m_string_value);
            if (bVar1) {
              ON_ClassArray<ON_UserString>::Remove(&this->m_e,k0._4_4_);
            }
            else {
              pOVar4 = ON_ClassArray<ON_UserString>::operator[](&this->m_e,k0._4_4_);
              ON_UserString::operator=(pOVar4,us);
            }
            local_30 = 1;
          }
          break;
        }
      }
      this_local._4_4_ = local_30;
    }
  }
  else {
    count0_plus_count._4_4_ = ON_ClassArray<ON_UserString>::Count(&this->m_e);
    nel = (size_t)(count0_plus_count._4_4_ + count);
    base = (ON_2dex *)onmalloc((nel + (long)count) * 8);
    local_74 = 0;
    for (k0._4_4_ = 0; k0._4_4_ < count0_plus_count._4_4_; k0._4_4_ = k0._4_4_ + 1) {
      pOVar4 = ON_ClassArray<ON_UserString>::operator[](&this->m_e,k0._4_4_);
      OVar3 = ON_wString::DataCRCLower(&pOVar4->m_key,0);
      base[k0._4_4_].i = OVar3;
      base[k0._4_4_].j = k0._4_4_;
    }
    for (k0._4_4_ = 0; k0._4_4_ < count; k0._4_4_ = k0._4_4_ + 1) {
      OVar3 = ON_wString::DataCRCLower(&us[k0._4_4_].m_key,0);
      base[nel + (long)k0._4_4_].i = OVar3;
      base[nel + (long)k0._4_4_].j = k0._4_4_;
      base[k0._4_4_ + count0_plus_count._4_4_].i = base[nel + (long)k0._4_4_].i;
      base[k0._4_4_ + count0_plus_count._4_4_].j =
           base[nel + (long)k0._4_4_].j + count0_plus_count._4_4_;
    }
    ON_qsort(base,nel,8,cmp_hash_2dex_ij);
    ON_ClassArray<ON_UserString>::Reserve(&this->m_e,(long)(count0_plus_count._4_4_ + count));
    for (k0._4_4_ = 0; k0._4_4_ < count; k0._4_4_ = k0._4_4_ + 1) {
      bVar1 = ON_wString::IsEmpty(&us[k0._4_4_].m_key);
      if (!bVar1) {
        pOStack_70 = ON_BinarySearch2dexArray(base[nel + (long)k0._4_4_].i,base,nel);
        if (pOStack_70 == (ON_2dex *)0x0) {
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_userdata.cpp"
                     ,0x3cd,"","There is a bug in this function.");
        }
        else {
          k1 = (long)pOStack_70 - (long)base >> 3;
          while( true ) {
            bVar1 = false;
            if (k1 != 0) {
              bVar1 = pOStack_70[-1].i == pOStack_70->i;
            }
            uStack_48 = k1;
            if (!bVar1) break;
            k1 = k1 - 1;
            pOStack_70 = pOStack_70 + -1;
          }
          do {
            uStack_48 = uStack_48 + 1;
            if ((nel <= uStack_48) || (base[uStack_48].i != base[k1].i)) break;
          } while (base[uStack_48].j <= k0._4_4_ + count0_plus_count._4_4_);
          if (base[k1].j < count0_plus_count._4_4_) {
            for (; k1 < uStack_48; k1 = k1 + 1) {
              if (base[k1].j < count0_plus_count._4_4_) {
                pOVar4 = ON_ClassArray<ON_UserString>::operator[](&this->m_e,base[k1].j);
                iVar2 = ON_wString::CompareOrdinal(&pOVar4->m_key,&us[k0._4_4_].m_key,true);
                if (iVar2 == 0) {
                  if (bReplace) {
                    pOVar4 = ON_ClassArray<ON_UserString>::operator[](&this->m_e,base[k1].j);
                    ON_UserString::operator=(pOVar4,us + k0._4_4_);
                    local_30 = local_30 + 1;
                    bVar1 = ON_wString::IsEmpty(&us[k0._4_4_].m_string_value);
                    if (bVar1) {
                      local_74 = local_74 + 1;
                    }
                  }
                  break;
                }
              }
            }
            if ((uStack_48 <= k1) &&
               (bVar1 = ON_wString::IsEmpty(&us[k0._4_4_].m_string_value), !bVar1)) {
              base[k1].j = count0_plus_count._4_4_;
              ON_ClassArray<ON_UserString>::Append(&this->m_e,us + k0._4_4_);
              local_30 = local_30 + 1;
              count0_plus_count._4_4_ = count0_plus_count._4_4_ + 1;
            }
          }
          else {
            bVar1 = ON_wString::IsEmpty(&us[k0._4_4_].m_string_value);
            if (!bVar1) {
              base[k1].j = count0_plus_count._4_4_;
              ON_ClassArray<ON_UserString>::Append(&this->m_e,us + k0._4_4_);
              local_30 = local_30 + 1;
              count0_plus_count._4_4_ = count0_plus_count._4_4_ + 1;
            }
          }
        }
      }
    }
    onfree(base);
    k0._4_4_ = ON_ClassArray<ON_UserString>::Count(&this->m_e);
    while (iVar2 = k0._4_4_ + -1, 0 < k0._4_4_ && 0 < local_74) {
      pOVar4 = ON_ClassArray<ON_UserString>::operator[](&this->m_e,iVar2);
      bVar1 = ON_wString::IsEmpty(&pOVar4->m_string_value);
      k0._4_4_ = iVar2;
      if (bVar1) {
        ON_ClassArray<ON_UserString>::Remove(&this->m_e,iVar2);
        local_74 = local_74 + -1;
      }
    }
    this_local._4_4_ = local_30;
  }
  return this_local._4_4_;
}

Assistant:

int ON_UserStringList::SetUserStrings( int count, const ON_UserString* us, bool bReplace )
{
  int added_count = 0;
  int i;

  if ( count <= 0 || 0 == us )
    return 0;

  if ( 1 == count )
  {
    // skip the hash table hoo haa
    if (  us[0].m_key.IsEmpty() )
      return 0;
    for ( i = 0; i < m_e.Count(); i++ )
    {
      if ( m_e[i].m_key.CompareOrdinal(us[0].m_key, true ) )
        continue;
      if ( bReplace )
      {
        if ( us[0].m_string_value.IsEmpty() )
          m_e.Remove(i);
        else
          m_e[i] = us[0];
        added_count++;
      }
      break;
    }
    return added_count;
  }

  size_t k0, k1;
  int count0 = m_e.Count();
  size_t count0_plus_count = (size_t)(count0 + count);
  ON_2dex* hash = (ON_2dex*)onmalloc( (count0_plus_count + count)*sizeof(hash[0]) );
  ON_2dex* hash1 =  hash + (count0_plus_count);
  const ON_2dex* h;
  int deleted_count = 0;

  for ( i = 0; i < count0; i++ )
  {
    hash[i].i = (int)m_e[i].m_key.DataCRCLower(0);
    hash[i].j = i;
  }

  for ( i = 0; i < count; i++ )
  {
    hash1[i].i = (int)us[i].m_key.DataCRCLower(0);
    hash1[i].j = i;
    hash[i+count0].i = hash1[i].i;
    hash[i+count0].j = hash1[i].j+count0;
  }
  ON_qsort(hash,count0_plus_count,sizeof(hash[0]),cmp_hash_2dex_ij);

  m_e.Reserve(count0+count);
  for ( i = 0; i < count; i++)
  {
    if ( us[i].m_key.IsEmpty() )
      continue;

    // Set k0, k1 so that hash[k0]....,hash[k1-1] are 
    // the hash[] entries keys with the same hash code
    // as us[i].m_key.
    h = ON_BinarySearch2dexArray(hash1[i].i,hash,count0_plus_count);
    if ( 0 == h )
    {
      ON_ERROR("There is a bug in this function.");
      continue;
    }
    k0 = h-hash;
    while ( k0 > 0 && h[-1].i == h[0].i )
    {
      // set h = first element in hash[] with this hash code.
      k0--;
      h--;
    }
    for (k1 = k0+1; k1 < count0_plus_count; k1++ )
    {
      if ( hash[k1].i != hash[k0].i )
        break;
      if ( hash[k1].j > i+count0 )
        break;
    }

    if ( hash[k0].j >= count0 )
    {
      // There are no entries in m_e[] with key matching hash,
      // so us[i].m_key is not present in m_e.
      if ( !us[i].m_string_value.IsEmpty() )
      {
        hash[k0].j = count0++;
        m_e.Append(us[i]);
        added_count++;
      }
      continue;
    }

    for (/* empty init*/; k0 < k1; k0++ )
    {
      if ( hash[k0].j < count0 )
      {
        if ( m_e[hash[k0].j].m_key.CompareOrdinal(us[i].m_key,true) )
          continue; // different keys with same hash
        if ( bReplace )
        {
          m_e[hash[k0].j] = us[i];
          added_count++;
          if ( us[i].m_string_value.IsEmpty() )
            deleted_count++;
        }
        break;
      }
    }

    if ( k0 >= k1 )
    {
      // hash is unique up to this point, so us[i].m_key is unique, 
      // so we add it if it is valid.
      if ( !us[i].m_string_value.IsEmpty() )
      {
        hash[k0].j = count0++;
        m_e.Append(us[i]);
        added_count++;
      }
    }
  }

  onfree(hash);

  // remove deleted items.
  i = m_e.Count();
  while ( i-- > 0 && deleted_count > 0 )
  {
    if ( m_e[i].m_string_value.IsEmpty() )
    {
      m_e.Remove(i);
      deleted_count--;
    }
  }

  return added_count;
}